

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

void Nwk_ManDfsNodes_rec(Nwk_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = pObj->pMan->nTravIds;
  if (pObj->TravId != iVar1) {
    pObj->TravId = iVar1;
    uVar2 = *(uint *)&pObj->field_0x20 & 7;
    if (uVar2 != 1) {
      if (uVar2 == 3) {
        for (lVar3 = 0; (lVar3 < pObj->nFanins && (pObj->pFanio[lVar3] != (Nwk_Obj_t *)0x0));
            lVar3 = lVar3 + 1) {
          Nwk_ManDfsNodes_rec(pObj->pFanio[lVar3],vNodes);
        }
        Vec_PtrPush(vNodes,pObj);
        return;
      }
      __assert_fail("Nwk_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                    ,0x169,"void Nwk_ManDfsNodes_rec(Nwk_Obj_t *, Vec_Ptr_t *)");
    }
  }
  return;
}

Assistant:

void Nwk_ManDfsNodes_rec( Nwk_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return;
    Nwk_ObjSetTravIdCurrent( pObj );
    if ( Nwk_ObjIsCi(pObj) )
        return;
    assert( Nwk_ObjIsNode(pObj) );
    Nwk_ObjForEachFanin( pObj, pNext, i )
        Nwk_ManDfsNodes_rec( pNext, vNodes );
    Vec_PtrPush( vNodes, pObj );
}